

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sarray2.c
# Opt level: O1

void * SparseArrayFind(SparseArray *sarray,uint32_t *index)

{
  SparseArray *sarray_00;
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  ulong uVar6;
  void *unaff_R15;
  
  uVar3 = *index >> ((byte)sarray->shift & 0x1f);
  if (sarray->shift == 0) {
    uVar6 = (ulong)(uVar3 & 0xff);
    do {
      if (sarray->data[uVar6] != (void *)0x0) {
        return sarray->data[uVar6];
      }
      *index = *index + 1;
      uVar6 = uVar6 + 1;
    } while (uVar6 != 0x100);
LAB_00115c3a:
    unaff_R15 = (void *)0x0;
  }
  else {
    uVar3 = uVar3 & 0xff;
    do {
      if (0xfe < uVar3) goto LAB_00115c3a;
      uVar2 = sarray->shift;
      do {
        uVar4 = uVar3;
        if (0xfe < uVar4) {
          uVar3 = 0xff;
          break;
        }
        sarray_00 = (SparseArray *)sarray->data[uVar4];
        if ((((sarray_00 == &EmptyArray24) || (sarray_00 == &EmptyArray16)) ||
            (sarray_00 == &EmptyArray)) || (sarray_00 == &EmptyArray8)) {
          *index = (1 << ((byte)sarray->shift & 0x1f)) + *index &
                   ~((0xff << ((byte)uVar2 & 0x1f)) >> 8);
LAB_00115c00:
          uVar3 = uVar4 + 1;
          bVar1 = true;
        }
        else {
          pvVar5 = SparseArrayFind(sarray_00,index);
          if (pvVar5 == (void *)0x0) goto LAB_00115c00;
          bVar1 = false;
          unaff_R15 = pvVar5;
          uVar3 = uVar4;
        }
      } while (bVar1);
    } while (0xfe < uVar4);
  }
  return unaff_R15;
}

Assistant:

static void *SparseArrayFind(SparseArray * sarray, uint32_t * index)
{
	uint32_t j = MASK_INDEX((*index));
	uint32_t max = MAX_INDEX(sarray);
	if (sarray->shift == 0)
	{
		while (j<=max)
		{
			if (sarray->data[j] != SARRAY_EMPTY)
			{
				return sarray->data[j];
			}
			(*index)++;
			j++;
		}
	}
	else while (j<max)
	{
		// If the shift is not 0, then we need to recursively look at child
		// nodes.
		uint32_t zeromask = ~((0xff << sarray->shift) >> base_shift);
		while (j<max)
		{
			//Look in child nodes
			SparseArray *child = sarray->data[j];
			// Skip over known-empty children
			if ((&EmptyArray == child) ||
			    (&EmptyArray8 == child) ||
			    (&EmptyArray16 == child) ||
			    (&EmptyArray24 == child))
			{
				//Add 2^n to index so j is still correct
				(*index) += 1<<sarray->shift;
				//Zero off the next component of the index so we don't miss any.
				*index &= zeromask;
			}
			else
			{
				// The recursive call will set index to the correct value for
				// the next index, but won't update j
				void * ret = SparseArrayFind(child, index);
				if (ret != SARRAY_EMPTY)
				{
					return ret;
				}
			}
			//Go to the next child
			j++;
		}
	}
	return SARRAY_EMPTY;
}